

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_re_match(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  lyxp_set *set_00;
  ly_bool lVar1;
  LY_ERR ret__;
  LY_ERR LVar2;
  lysc_node *plVar3;
  char *pcVar4;
  undefined8 *__ptr;
  void *pvVar5;
  size_t str_len;
  char *pcVar6;
  ly_ctx *plVar7;
  ly_err_item *err;
  
  set_00 = *args;
  if ((options & 0x1c) == 0) {
    LVar2 = lyxp_set_cast(set_00,LYXP_SET_STRING);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = lyxp_set_cast(args[1],LYXP_SET_STRING);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    __ptr = (undefined8 *)malloc(0x10);
    if (__ptr == (undefined8 *)0x0) {
      ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_re_match");
      return LY_EMEM;
    }
    *__ptr = 1;
    pvVar5 = calloc(1,0x40);
    __ptr[1] = pvVar5;
    if ((set->field_10).cur_node != (lyd_node *)0x0) {
      ly_log_location((lysc_node *)0x0,(set->field_10).cur_node,(char *)0x0,(ly_in *)0x0);
    }
    LVar2 = lys_compile_type_pattern_check
                      (set->ctx,(args[1]->val).str,(pcre2_code_8 **)((long)pvVar5 + 8));
    if ((set->field_10).cur_node != (lyd_node *)0x0) {
      ly_log_location_revert(0,1,0,0);
    }
    if (LVar2 == LY_SUCCESS) {
      pcVar4 = ((*args)->val).str;
      str_len = strlen(pcVar4);
      LVar2 = lyplg_type_validate_patterns((lysc_pattern **)(__ptr + 1),pcVar4,str_len,&err);
      pcre2_code_free_8(*(undefined8 *)(__ptr[1] + 8));
      free((void *)__ptr[1]);
      free(__ptr);
      if (LVar2 == LY_SUCCESS) {
        set_fill_boolean(set,'\x01');
        return LY_SUCCESS;
      }
      if (LVar2 != LY_EVALID) {
        ly_err_print(set->ctx,err);
        ly_err_free(err);
        return LVar2;
      }
      ly_err_free(err);
      set_fill_boolean(set,'\0');
      return LY_SUCCESS;
    }
    free(__ptr);
    return LVar2;
  }
  if ((set_00->type == LYXP_SET_SCNODE_SET) &&
     (plVar3 = warn_get_scnode_in_ctx(set_00), plVar3 != (lysc_node *)0x0)) {
    if ((plVar3->nodetype & 0xc) == 0) {
      plVar7 = set->ctx;
      pcVar4 = lys_nodetype2str(plVar3->nodetype);
      pcVar6 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
      if (lVar1 != '\0') goto LAB_001a6848;
      plVar7 = set->ctx;
      pcVar4 = plVar3->name;
      pcVar6 = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    ly_log(plVar7,LY_LLWRN,LY_SUCCESS,pcVar6,"xpath_re_match",pcVar4);
  }
LAB_001a6848:
  if ((args[1]->type == LYXP_SET_SCNODE_SET) &&
     (plVar3 = warn_get_scnode_in_ctx(args[1]), plVar3 != (lysc_node *)0x0)) {
    if ((plVar3->nodetype & 0xc) == 0) {
      plVar7 = set->ctx;
      pcVar4 = lys_nodetype2str(plVar3->nodetype);
      pcVar6 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
      if (lVar1 != '\0') goto LAB_001a68c3;
      plVar7 = set->ctx;
      pcVar4 = plVar3->name;
      pcVar6 = "Argument #2 of %s is node \"%s\", not of string-type.";
    }
    ly_log(plVar7,LY_LLWRN,LY_SUCCESS,pcVar6,"xpath_re_match",pcVar4);
  }
LAB_001a68c3:
  set_scnode_clear_ctx(set,1);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_re_match(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lysc_pattern **patterns = NULL, **pattern;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;
    struct ly_err_item *err;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    LY_ARRAY_NEW_RET(set->ctx, patterns, pattern, LY_EMEM);
    *pattern = calloc(1, sizeof **pattern);
    if (set->cur_node) {
        LOG_LOCSET(NULL, set->cur_node);
    }
    rc = lys_compile_type_pattern_check(set->ctx, args[1]->val.str, &(*pattern)->code);
    if (set->cur_node) {
        LOG_LOCBACK(0, 1);
    }
    if (rc != LY_SUCCESS) {
        LY_ARRAY_FREE(patterns);
        return rc;
    }

    rc = lyplg_type_validate_patterns(patterns, args[0]->val.str, strlen(args[0]->val.str), &err);
    pcre2_code_free((*pattern)->code);
    free(*pattern);
    LY_ARRAY_FREE(patterns);
    if (rc && (rc != LY_EVALID)) {
        ly_err_print(set->ctx, err);
        ly_err_free(err);
        return rc;
    }

    if (rc == LY_EVALID) {
        ly_err_free(err);
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return LY_SUCCESS;
}